

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O3

void __thiscall CTcDataStream::write_obj_id_selfref(CTcDataStream *this,CTcSymObj *obj_sym)

{
  uint32_t tmp;
  size_t in_RCX;
  char buf [4];
  undefined1 local_14 [4];
  
  CTcSymObjBase::add_self_ref_fixup(&obj_sym->super_CTcSymObjBase,this,this->ofs_);
  write(this,(int)local_14,(void *)0x4,in_RCX);
  return;
}

Assistant:

void CTcDataStream::write_obj_id_selfref(CTcSymObj *obj_sym)
{
    /* 
     *   Add a fixup list entry to the symbol.  This type of reference
     *   must be kept with the symbol rather than in the global list,
     *   because we must apply this type of fixup each time we renumber
     *   the symbol. 
     */
    obj_sym->add_self_ref_fixup(this, get_ofs());

    /* write the ID to the stream */
    write4(obj_sym->get_obj_id());
}